

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesQueueBindSparseTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::sparse::anon_unknown_2::SparseQueueBindTestInstance::iterate
          (TestStatus *__return_storage_ptr__,SparseQueueBindTestInstance *this)

{
  deInt32 *pdVar1;
  Move<vk::VkDevice_s_*> *pMVar2;
  DeviceDriver *vk;
  VkQueue pVVar3;
  VkResult VVar4;
  int iVar5;
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice;
  Queue *pQVar6;
  NotSupportedError *this_00;
  deUint32 dVar7;
  VkDevice_s *pVVar8;
  uint uVar9;
  pointer pQVar10;
  char *msg;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  pointer pSVar14;
  long lVar15;
  TestStatus *pTVar16;
  vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
  signalSemaphores;
  vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
  waitSemaphores;
  vector<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_> otherQueues;
  vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
  queueSubmissions;
  vector<unsigned_int,_std::allocator<unsigned_int>_> signalSemaphoresWaitDstStageMask;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  allSemaphores;
  QueueRequirementsVec requirements;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  bindSparseFences;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  regularFences;
  Handle<(vk::HandleType)4> *local_298;
  iterator iStack_290;
  Handle<(vk::HandleType)4> *local_288;
  Handle<(vk::HandleType)4> *local_278;
  iterator iStack_270;
  Handle<(vk::HandleType)4> *local_268;
  void *local_258;
  iterator iStack_250;
  Queue **local_248;
  vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
  local_238;
  Queue *local_220;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_218;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  local_1f8;
  TestStatus *local_1e0;
  undefined1 local_1d8 [8];
  SharedPtrStateBase *pSStack_1d0;
  InfoUnion local_1c8;
  VkBool32 local_128;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  local_f8;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  local_d8;
  Move<vk::Handle<(vk::HandleType)6>_> local_b8;
  Move<vk::Handle<(vk::HandleType)6>_> local_98;
  Move<vk::Handle<(vk::HandleType)4>_> local_78;
  Move<vk::Handle<(vk::HandleType)4>_> local_58;
  
  vk_00 = Context::getInstanceInterface
                    ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  physicalDevice =
       Context::getPhysicalDevice
                 ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  local_258 = (void *)0x0;
  iStack_250._M_current = (Queue **)0x0;
  local_248 = (Queue **)0x0;
  ::vk::getPhysicalDeviceFeatures((VkPhysicalDeviceFeatures *)local_1d8,vk_00,physicalDevice);
  if (local_128 == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Sparse binding not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesQueueBindSparseTests.cpp"
               ,0xa3);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_1d8 = (undefined1  [8])0x0;
  pSStack_1d0 = (SharedPtrStateBase *)0x0;
  local_1c8._0_8_ = (pointer)0x0;
  local_1f8.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000008;
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  emplace_back<vkt::sparse::QueueRequirements>
            ((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
              *)local_1d8,(QueueRequirements *)&local_1f8);
  local_1f8.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)((ulong)(this->m_params).numQueues << 0x20);
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  emplace_back<vkt::sparse::QueueRequirements>
            ((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
              *)local_1d8,(QueueRequirements *)&local_1f8);
  SparseResourcesBaseInstance::createDeviceSupportingQueues
            (&this->super_SparseResourcesBaseInstance,(QueueRequirementsVec *)local_1d8);
  pQVar6 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,8,0);
  if ((this->m_params).numQueues != 0) {
    dVar7 = 0;
    do {
      local_1f8.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)SparseResourcesBaseInstance::getQueue
                              (&this->super_SparseResourcesBaseInstance,0,dVar7);
      if (*(VkQueue *)
           local_1f8.
           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start != pQVar6->queueHandle) {
        if (iStack_250._M_current == local_248) {
          std::vector<vkt::sparse::Queue_const*,std::allocator<vkt::sparse::Queue_const*>>::
          _M_realloc_insert<vkt::sparse::Queue_const*const&>
                    ((vector<vkt::sparse::Queue_const*,std::allocator<vkt::sparse::Queue_const*>> *)
                     &local_258,iStack_250,(Queue **)&local_1f8);
        }
        else {
          *iStack_250._M_current =
               (Queue *)local_1f8.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          iStack_250._M_current = iStack_250._M_current + 1;
        }
      }
      dVar7 = dVar7 + 1;
    } while (dVar7 < (this->m_params).numQueues);
  }
  local_220 = pQVar6;
  local_1e0 = __return_storage_ptr__;
  if (local_1d8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1d8,local_1c8._0_8_ - (long)local_1d8);
  }
  vk = (this->super_SparseResourcesBaseInstance).m_deviceDriver.
       super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
  uVar11 = 0;
  local_1f8.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268 = (Handle<(vk::HandleType)4> *)0x0;
  local_278 = (Handle<(vk::HandleType)4> *)0x0;
  iStack_270._M_current = (Handle<(vk::HandleType)4> *)0x0;
  local_288 = (Handle<(vk::HandleType)4> *)0x0;
  local_298 = (Handle<(vk::HandleType)4> *)0x0;
  iStack_290._M_current = (Handle<(vk::HandleType)4> *)0x0;
  local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->m_params).numWaitSemaphores != 0) {
    uVar9 = 0;
    do {
      ::vk::createSemaphore
                (&local_58,&vk->super_DeviceInterface,
                 (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object,0,(VkAllocationCallbacks *)0x0);
      pQVar6 = (Queue *)operator_new(0x20);
      pQVar6[1].queueHandle =
           (VkQueue)local_58.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device;
      *(VkAllocationCallbacks **)&pQVar6[1].queueFamilyIndex =
           local_58.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator;
      pQVar6->queueHandle =
           (VkQueue)local_58.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal;
      *(DeviceInterface **)&pQVar6->queueFamilyIndex =
           local_58.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface;
      local_58.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal = 0;
      local_58.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_58.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device = (VkDevice)0x0
      ;
      local_58.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      pSStack_1d0 = (SharedPtrStateBase *)0x0;
      local_1d8 = (undefined1  [8])pQVar6;
      pSStack_1d0 = (SharedPtrStateBase *)operator_new(0x20);
      pSStack_1d0->strongRefCount = 0;
      pSStack_1d0->weakRefCount = 0;
      pSStack_1d0->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00cef1f0;
      pSStack_1d0[1]._vptr_SharedPtrStateBase = (_func_int **)pQVar6;
      pSStack_1d0->strongRefCount = 1;
      pSStack_1d0->weakRefCount = 1;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>>>>>
      ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>>>>
                ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>>>>>
                  *)&local_1f8,
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_> *)local_1d8);
      if (pSStack_1d0 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &pSStack_1d0->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_1d8 = (undefined1  [8])0x0;
          (*pSStack_1d0->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &pSStack_1d0->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (pSStack_1d0 != (SharedPtrStateBase *)0x0) {
            (*pSStack_1d0->_vptr_SharedPtrStateBase[1])();
          }
          pSStack_1d0 = (SharedPtrStateBase *)0x0;
        }
      }
      if (local_58.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()
                  (&local_58.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter,
                   (VkSemaphore)
                   local_58.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal);
      }
      local_58.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device = (VkDevice)0x0
      ;
      local_58.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      local_58.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal = 0;
      local_58.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      if (iStack_270._M_current == local_268) {
        std::vector<vk::Handle<(vk::HandleType)4>,std::allocator<vk::Handle<(vk::HandleType)4>>>::
        _M_realloc_insert<vk::Handle<(vk::HandleType)4>const&>
                  ((vector<vk::Handle<(vk::HandleType)4>,std::allocator<vk::Handle<(vk::HandleType)4>>>
                    *)&local_278,iStack_270,
                   (Handle<(vk::HandleType)4> *)
                   local_1f8.
                   super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
      }
      else {
        (iStack_270._M_current)->m_internal =
             ((local_1f8.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->
             super_RefBase<vk::Handle<(vk::HandleType)4>_>).m_data.object.m_internal;
        iStack_270._M_current = iStack_270._M_current + 1;
      }
      uVar9 = uVar9 + 1;
      uVar11 = (this->m_params).numWaitSemaphores;
    } while (uVar9 < uVar11);
  }
  if ((this->m_params).numSignalSemaphores != 0) {
    uVar11 = 0;
    do {
      ::vk::createSemaphore
                (&local_78,&vk->super_DeviceInterface,
                 (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object,0,(VkAllocationCallbacks *)0x0);
      pQVar6 = (Queue *)operator_new(0x20);
      pQVar6[1].queueHandle =
           (VkQueue)local_78.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device;
      *(VkAllocationCallbacks **)&pQVar6[1].queueFamilyIndex =
           local_78.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator;
      pQVar6->queueHandle =
           (VkQueue)local_78.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal;
      *(DeviceInterface **)&pQVar6->queueFamilyIndex =
           local_78.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface;
      local_78.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal = 0;
      local_78.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_78.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device = (VkDevice)0x0
      ;
      local_78.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      pSStack_1d0 = (SharedPtrStateBase *)0x0;
      local_1d8 = (undefined1  [8])pQVar6;
      pSStack_1d0 = (SharedPtrStateBase *)operator_new(0x20);
      pSStack_1d0->strongRefCount = 0;
      pSStack_1d0->weakRefCount = 0;
      pSStack_1d0->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00cef1f0;
      pSStack_1d0[1]._vptr_SharedPtrStateBase = (_func_int **)pQVar6;
      pSStack_1d0->strongRefCount = 1;
      pSStack_1d0->weakRefCount = 1;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>>>>>
      ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>>>>
                ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>>>>>
                  *)&local_1f8,
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_> *)local_1d8);
      if (pSStack_1d0 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &pSStack_1d0->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_1d8 = (undefined1  [8])0x0;
          (*pSStack_1d0->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &pSStack_1d0->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (pSStack_1d0 != (SharedPtrStateBase *)0x0) {
            (*pSStack_1d0->_vptr_SharedPtrStateBase[1])();
          }
          pSStack_1d0 = (SharedPtrStateBase *)0x0;
        }
      }
      if (local_78.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()
                  (&local_78.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter,
                   (VkSemaphore)
                   local_78.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal);
      }
      local_78.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device = (VkDevice)0x0
      ;
      local_78.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      local_78.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal = 0;
      local_78.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      if (iStack_290._M_current == local_288) {
        std::vector<vk::Handle<(vk::HandleType)4>,std::allocator<vk::Handle<(vk::HandleType)4>>>::
        _M_realloc_insert<vk::Handle<(vk::HandleType)4>const&>
                  ((vector<vk::Handle<(vk::HandleType)4>,std::allocator<vk::Handle<(vk::HandleType)4>>>
                    *)&local_298,iStack_290,
                   (Handle<(vk::HandleType)4> *)
                   local_1f8.
                   super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
      }
      else {
        (iStack_290._M_current)->m_internal =
             ((local_1f8.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->
             super_RefBase<vk::Handle<(vk::HandleType)4>_>).m_data.object.m_internal;
        iStack_290._M_current = iStack_290._M_current + 1;
      }
      local_1d8._0_4_ = 0x10000;
      if (local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_218,
                   (iterator)
                   local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish,(uint *)local_1d8);
      }
      else {
        *local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = 0x10000;
        local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (this->m_params).numSignalSemaphores);
    uVar11 = (this->m_params).numWaitSemaphores;
  }
  if ((uVar11 != 0) &&
     (uVar9 = (uint)((ulong)((long)iStack_250._M_current - (long)local_258) >> 3),
     uVar9 != 0xffffffff)) {
    uVar13 = (ulong)(uVar11 - 1);
    lVar12 = uVar13 * 8;
    do {
      uVar9 = uVar9 - 1;
      if (uVar9 == 0xffffffff) {
        local_1c8.regular.pSignalSemaphores = local_278;
        if (iStack_270._M_current == local_278) {
          local_1c8.regular.pSignalSemaphores = (Handle<(vk::HandleType)4> *)0x0;
        }
        pSStack_1d0 = (SharedPtrStateBase *)((ulong)pSStack_1d0._1_7_ << 8);
        local_1d8 = (undefined1  [8])local_220;
        local_1c8.regular.sType = 4;
        local_1c8.regular.pNext = (void *)0x0;
        local_1c8.regular.waitSemaphoreCount = 0;
        local_1c8.regular.pCommandBuffers = (VkCommandBuffer *)0x0;
        local_1c8.sparse.pBufferBinds =
             (VkSparseBufferMemoryBindInfo *)((ulong)(uint)local_1c8._44_4_ << 0x20);
        local_1c8.regular.pWaitSemaphores = (VkSemaphore *)0x0;
        local_1c8.regular.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
        local_1c8.regular.signalSemaphoreCount = uVar11;
        std::
        vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
        ::push_back(&local_238,(value_type *)local_1d8);
        break;
      }
      local_1c8.regular.pSignalSemaphores =
           (Handle<(vk::HandleType)4> *)((long)&local_278->m_internal + lVar12);
      if ((ulong)((long)iStack_270._M_current - (long)local_278 >> 3) <= uVar13) {
        local_1c8.regular.pSignalSemaphores = (Handle<(vk::HandleType)4> *)0x0;
      }
      local_1d8 = *(undefined1 (*) [8])((long)local_258 + (ulong)uVar9 * 8);
      pSStack_1d0 = (SharedPtrStateBase *)((ulong)pSStack_1d0._1_7_ << 8);
      local_1c8.regular.sType = 4;
      local_1c8.regular.pNext = (void *)0x0;
      local_1c8.regular.waitSemaphoreCount = 0;
      local_1c8.regular.pCommandBuffers = (VkCommandBuffer *)0x0;
      local_1c8.sparse.pBufferBinds =
           (VkSparseBufferMemoryBindInfo *)((ulong)(uint)local_1c8._44_4_ << 0x20);
      local_1c8.regular.pWaitSemaphores = (VkSemaphore *)0x0;
      local_1c8.regular.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
      local_1c8.regular.signalSemaphoreCount = 1;
      std::
      vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
      ::push_back(&local_238,(value_type *)local_1d8);
      uVar11 = uVar11 - 1;
      lVar12 = lVar12 + -8;
      uVar13 = uVar13 - 1;
    } while (uVar11 != 0);
  }
  if ((this->m_params).emptySubmission == false) {
    local_1c8.regular.pWaitSemaphores = local_278;
    if (iStack_270._M_current == local_278) {
      local_1c8.regular.pWaitSemaphores = (Handle<(vk::HandleType)4> *)0x0;
    }
    local_1c8.regular.waitSemaphoreCount = (this->m_params).numWaitSemaphores;
    local_1c8.sparse.pSignalSemaphores = local_298;
    if (iStack_290._M_current == local_298) {
      local_1c8.sparse.pSignalSemaphores = (Handle<(vk::HandleType)4> *)0x0;
    }
    local_1c8.sparse.signalSemaphoreCount = (this->m_params).numSignalSemaphores;
    pSStack_1d0 = (SharedPtrStateBase *)CONCAT71(pSStack_1d0._1_7_,1);
    local_1d8 = (undefined1  [8])local_220;
    local_1c8.regular.sType = 7;
    local_1c8.regular.pNext = (void *)0x0;
    local_1c8.regular.pWaitDstStageMask =
         (VkPipelineStageFlags *)((ulong)(uint)local_1c8._36_4_ << 0x20);
    local_1c8.sparse.pBufferBinds = (VkSparseBufferMemoryBindInfo *)0x0;
    local_1c8.regular.pCommandBuffers = (VkCommandBuffer *)((ulong)(uint)local_1c8._52_4_ << 0x20);
    local_1c8.sparse.pImageOpaqueBinds = (VkSparseImageOpaqueMemoryBindInfo *)0x0;
    local_1c8.regular.pSignalSemaphores = (VkSemaphore *)((ulong)(uint)local_1c8._68_4_ << 0x20);
    local_1c8.sparse.pImageBinds = (VkSparseImageMemoryBindInfo *)0x0;
    std::
    vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
    ::push_back(&local_238,(value_type *)local_1d8);
  }
  else {
    pSStack_1d0 = (SharedPtrStateBase *)CONCAT71(pSStack_1d0._1_7_,1);
    local_1d8 = (undefined1  [8])local_220;
    local_1c8.regular.sType = 7;
    local_1c8.regular.pNext = (void *)0x0;
    local_1c8.regular.waitSemaphoreCount = 0;
    local_1c8.regular.pWaitSemaphores = (Handle<(vk::HandleType)4> *)0x0;
    local_1c8.regular.pWaitDstStageMask =
         (VkPipelineStageFlags *)((ulong)(uint)local_1c8._36_4_ << 0x20);
    local_1c8.sparse.pBufferBinds = (VkSparseBufferMemoryBindInfo *)0x0;
    local_1c8.regular.pCommandBuffers = (VkCommandBuffer *)((ulong)(uint)local_1c8._52_4_ << 0x20);
    local_1c8.sparse.pImageOpaqueBinds = (VkSparseImageOpaqueMemoryBindInfo *)0x0;
    local_1c8.regular.pSignalSemaphores = (VkSemaphore *)((ulong)(uint)local_1c8._68_4_ << 0x20);
    local_1c8.sparse.pImageBinds = (VkSparseImageMemoryBindInfo *)0x0;
    local_1c8.sparse.signalSemaphoreCount = 0;
    local_1c8.sparse.pSignalSemaphores = (Handle<(vk::HandleType)4> *)0x0;
    std::
    vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
    ::push_back(&local_238,(value_type *)local_1d8);
  }
  if ((((this->m_params).emptySubmission == false) &&
      (dVar7 = (this->m_params).numSignalSemaphores, dVar7 != 0)) &&
     (uVar11 = (uint)((ulong)((long)iStack_250._M_current - (long)local_258) >> 3),
     uVar11 != 0xffffffff)) {
    uVar13 = (ulong)(dVar7 - 1);
    lVar12 = uVar13 * 4;
    lVar15 = uVar13 * 8;
    do {
      uVar11 = uVar11 - 1;
      if (uVar11 == 0xffffffff) {
        local_1c8.regular.pWaitSemaphores = local_298;
        if (iStack_290._M_current == local_298) {
          local_1c8.regular.pWaitSemaphores = (Handle<(vk::HandleType)4> *)0x0;
        }
        local_1c8.regular.pWaitDstStageMask =
             local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
        if (local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_1c8.regular.pWaitDstStageMask =
               (VkPipelineStageFlags *)(Handle<(vk::HandleType)4> *)0x0;
        }
        pSStack_1d0 = (SharedPtrStateBase *)((ulong)pSStack_1d0._1_7_ << 8);
        local_1d8 = (undefined1  [8])local_220;
        local_1c8.regular.sType = 4;
        local_1c8.regular.pNext = (void *)0x0;
        local_1c8.sparse.pBufferBinds =
             (VkSparseBufferMemoryBindInfo *)((ulong)(uint)local_1c8._44_4_ << 0x20);
        local_1c8.regular.pCommandBuffers = (VkCommandBuffer *)0x0;
        local_1c8.sparse.pImageOpaqueBinds =
             (VkSparseImageOpaqueMemoryBindInfo *)((ulong)(uint)local_1c8._60_4_ << 0x20);
        local_1c8.regular.pSignalSemaphores = (VkSemaphore *)0x0;
        local_1c8.regular.waitSemaphoreCount = dVar7;
        std::
        vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
        ::push_back(&local_238,(value_type *)local_1d8);
        break;
      }
      local_1c8.regular.pWaitSemaphores =
           (Handle<(vk::HandleType)4> *)((long)&local_298->m_internal + lVar15);
      if ((ulong)((long)iStack_290._M_current - (long)local_298 >> 3) <= uVar13) {
        local_1c8.regular.pWaitSemaphores = (Handle<(vk::HandleType)4> *)0x0;
      }
      local_1c8.regular.pWaitDstStageMask =
           (VkPipelineStageFlags *)
           (Handle<(vk::HandleType)4> *)
           ((long)(deUint64 *)
                  local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar12);
      if ((ulong)((long)local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar13) {
        local_1c8.regular.pWaitDstStageMask =
             (VkPipelineStageFlags *)(Handle<(vk::HandleType)4> *)0x0;
      }
      local_1d8 = *(undefined1 (*) [8])((long)local_258 + (ulong)uVar11 * 8);
      pSStack_1d0 = (SharedPtrStateBase *)((ulong)pSStack_1d0._1_7_ << 8);
      local_1c8.regular.sType = 4;
      local_1c8.regular.pNext = (void *)0x0;
      local_1c8.regular.waitSemaphoreCount = 1;
      local_1c8.sparse.pBufferBinds =
           (VkSparseBufferMemoryBindInfo *)((ulong)(uint)local_1c8._44_4_ << 0x20);
      local_1c8.regular.pCommandBuffers = (VkCommandBuffer *)0x0;
      local_1c8.sparse.pImageOpaqueBinds =
           (VkSparseImageOpaqueMemoryBindInfo *)((ulong)(uint)local_1c8._60_4_ << 0x20);
      local_1c8.regular.pSignalSemaphores = (VkSemaphore *)0x0;
      std::
      vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
      ::push_back(&local_238,(value_type *)local_1d8);
      dVar7 = dVar7 - 1;
      lVar12 = lVar12 + -4;
      uVar13 = uVar13 - 1;
      lVar15 = lVar15 + -8;
    } while (dVar7 != 0);
  }
  local_d8.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pMVar2 = &(this->super_SparseResourcesBaseInstance).m_logicalDevice;
  pQVar10 = local_238.
            super__Vector_base<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_238.
      super__Vector_base<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_238.
      super__Vector_base<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pVVar8 = (pMVar2->super_RefBase<vk::VkDevice_s_*>).m_data.object;
    pTVar16 = local_1e0;
  }
  else {
    do {
      if (pQVar10->isSparseBinding == true) {
        if ((this->m_params).bindSparseUseFence == true) {
          ::vk::createFence(&local_98,&vk->super_DeviceInterface,
                            (pMVar2->super_RefBase<vk::VkDevice_s_*>).m_data.object,0,
                            (VkAllocationCallbacks *)0x0);
          pQVar6 = (Queue *)operator_new(0x20);
          pQVar6[1].queueHandle =
               (VkQueue)local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                        m_device;
          *(VkAllocationCallbacks **)&pQVar6[1].queueFamilyIndex =
               local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator;
          pQVar6->queueHandle =
               (VkQueue)local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                        m_internal;
          *(DeviceInterface **)&pQVar6->queueFamilyIndex =
               local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface;
          local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
          local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
               (DeviceInterface *)0x0;
          local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
               (VkDevice)0x0;
          local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
               (VkAllocationCallbacks *)0x0;
          pSStack_1d0 = (SharedPtrStateBase *)0x0;
          local_1d8 = (undefined1  [8])pQVar6;
          pSStack_1d0 = (SharedPtrStateBase *)operator_new(0x20);
          pSStack_1d0->strongRefCount = 0;
          pSStack_1d0->weakRefCount = 0;
          pSStack_1d0->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00cef270;
          pSStack_1d0[1]._vptr_SharedPtrStateBase = (_func_int **)pQVar6;
          pSStack_1d0->strongRefCount = 1;
          pSStack_1d0->weakRefCount = 1;
          std::
          vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>>>>>
          ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>>>>
                    ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>>>>>
                      *)&local_f8,
                     (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_> *)local_1d8
                    );
          if (pSStack_1d0 != (SharedPtrStateBase *)0x0) {
            LOCK();
            pdVar1 = &pSStack_1d0->strongRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              local_1d8 = (undefined1  [8])0x0;
              (*pSStack_1d0->_vptr_SharedPtrStateBase[2])();
            }
            LOCK();
            pdVar1 = &pSStack_1d0->weakRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              if (pSStack_1d0 != (SharedPtrStateBase *)0x0) {
                (*pSStack_1d0->_vptr_SharedPtrStateBase[1])();
              }
              pSStack_1d0 = (SharedPtrStateBase *)0x0;
            }
          }
          if (local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal != 0)
          {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                      (&local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter,
                       (VkFence)local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object
                                .m_internal);
          }
          local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
               (VkDevice)0x0;
          local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
               (VkAllocationCallbacks *)0x0;
          local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
          local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
               (DeviceInterface *)0x0;
        }
        pVVar3 = pQVar10->queue->queueHandle;
        if ((this->m_params).emptySubmission == true) {
          VVar4 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x11])(vk,pVVar3,0,0);
          iVar5 = 0x11d;
          msg = "vk.queueBindSparse(submissionIter->queue->queueHandle, 0u, DE_NULL, fence)";
        }
        else {
          VVar4 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x11])
                            (vk,pVVar3,1,&pQVar10->info);
          iVar5 = 0x11f;
          msg = 
          "vk.queueBindSparse(submissionIter->queue->queueHandle, 1u, &submissionIter->info.sparse, fence)"
          ;
        }
        ::vk::checkResult(VVar4,msg,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesQueueBindSparseTests.cpp"
                          ,iVar5);
      }
      else {
        ::vk::createFence(&local_b8,&vk->super_DeviceInterface,
                          (pMVar2->super_RefBase<vk::VkDevice_s_*>).m_data.object,0,
                          (VkAllocationCallbacks *)0x0);
        pQVar6 = (Queue *)operator_new(0x20);
        pQVar6[1].queueHandle =
             (VkQueue)local_b8.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device
        ;
        *(VkAllocationCallbacks **)&pQVar6[1].queueFamilyIndex =
             local_b8.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator;
        pQVar6->queueHandle =
             (VkQueue)local_b8.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                      m_internal;
        *(DeviceInterface **)&pQVar6->queueFamilyIndex =
             local_b8.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface;
        local_b8.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
        local_b8.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        local_b8.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_b8.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        pSStack_1d0 = (SharedPtrStateBase *)0x0;
        local_1d8 = (undefined1  [8])pQVar6;
        pSStack_1d0 = (SharedPtrStateBase *)operator_new(0x20);
        pSStack_1d0->strongRefCount = 0;
        pSStack_1d0->weakRefCount = 0;
        pSStack_1d0->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00cef270;
        pSStack_1d0[1]._vptr_SharedPtrStateBase = (_func_int **)pQVar6;
        pSStack_1d0->strongRefCount = 1;
        pSStack_1d0->weakRefCount = 1;
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>>>>>
        ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>>>>
                  ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>>>>>
                    *)&local_d8,
                   (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_> *)local_1d8);
        if (pSStack_1d0 != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &pSStack_1d0->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_1d8 = (undefined1  [8])0x0;
            (*pSStack_1d0->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &pSStack_1d0->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if (pSStack_1d0 != (SharedPtrStateBase *)0x0) {
              (*pSStack_1d0->_vptr_SharedPtrStateBase[1])();
            }
            pSStack_1d0 = (SharedPtrStateBase *)0x0;
          }
        }
        if (local_b8.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                    (&local_b8.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter,
                     (VkFence)local_b8.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                              m_internal);
        }
        local_b8.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_b8.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        local_b8.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
        local_b8.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        VVar4 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[2])
                          (vk,pQVar10->queue->queueHandle,1,&pQVar10->info);
        ::vk::checkResult(VVar4,
                          "vk.queueSubmit(submissionIter->queue->queueHandle, 1u, &submissionIter->info.regular, **regularFences.back())"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesQueueBindSparseTests.cpp"
                          ,0x124);
      }
      pTVar16 = local_1e0;
      pQVar10 = pQVar10 + 1;
    } while (pQVar10 !=
             local_238.
             super__Vector_base<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    pVVar8 = (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object;
    pSVar14 = local_f8.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_f8.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_f8.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        iVar5 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x16])
                          (vk,pVVar8,1,pSVar14->m_ptr,1,0xffffffffffffffff);
        if (iVar5 != 0) {
          local_1d8 = (undefined1  [8])&local_1c8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1d8,"vkQueueBindSparse didn\'t signal the fence","");
          pTVar16->m_code = QP_TEST_RESULT_FAIL;
          (pTVar16->m_description)._M_dataplus._M_p = (pointer)&(pTVar16->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pTVar16->m_description,local_1d8,
                     (long)(VkStructureType *)local_1d8 +
                     (long)&pSStack_1d0->_vptr_SharedPtrStateBase);
          goto LAB_0073aac6;
        }
        pSVar14 = pSVar14 + 1;
      } while (pSVar14 !=
               local_f8.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
      pVVar8 = (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object;
    }
  }
  pSVar14 = local_d8.
            super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pSVar14 ==
        local_d8.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
      ::~vector(&local_f8);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
      ::~vector(&local_d8);
      VVar4 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[4])
                        (vk,(this->super_SparseResourcesBaseInstance).m_logicalDevice.
                            super_RefBase<vk::VkDevice_s_*>.m_data.object);
      ::vk::checkResult(VVar4,"vk.deviceWaitIdle(getDevice())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesQueueBindSparseTests.cpp"
                        ,0x130);
      local_1d8 = (undefined1  [8])&local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Pass","");
      pTVar16->m_code = QP_TEST_RESULT_PASS;
      (pTVar16->m_description)._M_dataplus._M_p = (pointer)&(pTVar16->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pTVar16->m_description,local_1d8,
                 (long)(VkStructureType *)local_1d8 + (long)&pSStack_1d0->_vptr_SharedPtrStateBase);
      if (local_1d8 != (undefined1  [8])&local_1c8) {
        operator_delete((void *)local_1d8,(ulong)(local_1c8._0_8_ + 1));
      }
LAB_0073aafd:
      if (local_238.
          super__Vector_base<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_238.
                        super__Vector_base<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_238.
                              super__Vector_base<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_238.
                              super__Vector_base<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((Handle<(vk::HandleType)4> *)
          local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (Handle<(vk::HandleType)4> *)0x0) {
        operator_delete(local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_218.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_218.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_298 != (Handle<(vk::HandleType)4> *)0x0) {
        operator_delete(local_298,(long)local_288 - (long)local_298);
      }
      if (local_278 != (Handle<(vk::HandleType)4> *)0x0) {
        operator_delete(local_278,(long)local_268 - (long)local_278);
      }
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
      ::~vector(&local_1f8);
      if (local_258 != (void *)0x0) {
        operator_delete(local_258,(long)local_248 - (long)local_258);
      }
      return pTVar16;
    }
    iVar5 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x16])
                      (vk,pVVar8,1,pSVar14->m_ptr,1,0xffffffffffffffff);
    if (iVar5 != 0) {
      local_1d8 = (undefined1  [8])&local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d8,
                 "Some fences weren\'t signaled (vkQueueBindSparse didn\'t signal semaphores?)","");
      pTVar16->m_code = QP_TEST_RESULT_FAIL;
      (pTVar16->m_description)._M_dataplus._M_p = (pointer)&(pTVar16->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pTVar16->m_description,local_1d8,
                 (long)(VkStructureType *)local_1d8 + (long)&pSStack_1d0->_vptr_SharedPtrStateBase);
LAB_0073aac6:
      if (local_1d8 != (undefined1  [8])&local_1c8) {
        operator_delete((void *)local_1d8,(ulong)(local_1c8._0_8_ + 1));
      }
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
      ::~vector(&local_f8);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
      ::~vector(&local_d8);
      goto LAB_0073aafd;
    }
    pSVar14 = pSVar14 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const InstanceInterface&	vki				= m_context.getInstanceInterface();
		const VkPhysicalDevice		physDevice		= m_context.getPhysicalDevice();
		const Queue*				sparseQueue		= DE_NULL;
		std::vector<const Queue*>	otherQueues;

		if (!getPhysicalDeviceFeatures(vki, physDevice).sparseBinding)
			TCU_THROW(NotSupportedError, "Sparse binding not supported");

		// Determine required queues and create a device that supports them
		{
			QueueRequirementsVec requirements;
			requirements.push_back(QueueRequirements(VK_QUEUE_SPARSE_BINDING_BIT, 1u));
			requirements.push_back(QueueRequirements((VkQueueFlags)0, m_params.numQueues));		// any queue flags

			createDeviceSupportingQueues(requirements);

			sparseQueue = &getQueue(VK_QUEUE_SPARSE_BINDING_BIT, 0u);

			// We probably have picked the sparse queue again, so filter it out
			for (deUint32 queueNdx = 0u; queueNdx < m_params.numQueues; ++queueNdx)
			{
				const Queue* queue = &getQueue((VkQueueFlags)0, queueNdx);
				if (queue->queueHandle != sparseQueue->queueHandle)
					otherQueues.push_back(queue);
			}
		}

		const DeviceInterface&				vk = getDeviceInterface();

		std::vector<SemaphoreSp>			allSemaphores;
		std::vector<VkSemaphore>			waitSemaphores;
		std::vector<VkSemaphore>			signalSemaphores;
		std::vector<VkPipelineStageFlags>	signalSemaphoresWaitDstStageMask;
		std::vector<QueueSubmission>		queueSubmissions;

		for (deUint32 i = 0; i < m_params.numWaitSemaphores; ++i)
		{
			allSemaphores.push_back(makeVkSharedPtr(createSemaphore(vk, getDevice())));
			waitSemaphores.push_back(**allSemaphores.back());
		}

		for (deUint32 i = 0; i < m_params.numSignalSemaphores; ++i)
		{
			allSemaphores.push_back(makeVkSharedPtr(createSemaphore(vk, getDevice())));
			signalSemaphores.push_back(**allSemaphores.back());
			signalSemaphoresWaitDstStageMask.push_back(VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
		}

		// Prepare submissions: signal semaphores for the sparse bind operation
		{
			deUint32 numQueues		= 1u + static_cast<deUint32>(otherQueues.size());
			deUint32 numSemaphores	= m_params.numWaitSemaphores;

			while (numSemaphores > 0u && numQueues > 0u)
			{
				if (numQueues == 1u)	// sparse queue is assigned last
				{
					// sparse queue can handle regular submissions as well
					queueSubmissions.push_back(makeSubmissionRegular(
						sparseQueue, 0u, DE_NULL, DE_NULL, numSemaphores, getDataOrNullptr(waitSemaphores)));
					numSemaphores	= 0u;
					numQueues		= 0u;
				}
				else
				{
					queueSubmissions.push_back(makeSubmissionRegular(
						otherQueues[numQueues - 2], 0u, DE_NULL, DE_NULL, 1u, getDataOrNullptr(waitSemaphores, numSemaphores - 1)));
					--numQueues;
					--numSemaphores;
				}
			}
		}

		// Prepare submission: bind sparse
		if (!m_params.emptySubmission)
		{
			queueSubmissions.push_back(makeSubmissionSparse(
				sparseQueue, m_params.numWaitSemaphores, getDataOrNullptr(waitSemaphores), m_params.numSignalSemaphores, getDataOrNullptr(signalSemaphores)));
		}
		else
		{
			// a dummy submission, won't be used in a call to vkQueueBindSparse
			queueSubmissions.push_back(makeSubmissionSparse(sparseQueue, 0u, DE_NULL, 0u, DE_NULL));
		}

		// Prepare submissions: wait on semaphores signaled by the sparse bind operation
		if (!m_params.emptySubmission)
		{
			deUint32 numQueues		= 1u + static_cast<deUint32>(otherQueues.size());
			deUint32 numSemaphores	= m_params.numSignalSemaphores;

			while (numSemaphores > 0u && numQueues > 0u)
			{
				if (numQueues == 1u)
				{
					queueSubmissions.push_back(makeSubmissionRegular(
						sparseQueue, numSemaphores, getDataOrNullptr(signalSemaphores), getDataOrNullptr(signalSemaphoresWaitDstStageMask), 0u, DE_NULL));
					numSemaphores	= 0u;
					numQueues		= 0u;
				}
				else
				{
					queueSubmissions.push_back(makeSubmissionRegular(
						otherQueues[numQueues - 2], 1u, getDataOrNullptr(signalSemaphores, numSemaphores - 1), getDataOrNullptr(signalSemaphoresWaitDstStageMask, numSemaphores - 1), 0u, DE_NULL));
					--numQueues;
					--numSemaphores;
				}
			}
		}

		// Submit to queues
		{
			std::vector<FenceSp>	regularFences;
			std::vector<FenceSp>	bindSparseFences;

			for (std::vector<QueueSubmission>::const_iterator submissionIter = queueSubmissions.begin(); submissionIter != queueSubmissions.end(); ++submissionIter)
			{
				if (submissionIter->isSparseBinding)
				{
					VkFence fence = DE_NULL;

					if (m_params.bindSparseUseFence)
					{
						bindSparseFences.push_back(makeVkSharedPtr(createFence(vk, getDevice())));
						fence = **bindSparseFences.back();
					}

					if (m_params.emptySubmission)
						VK_CHECK(vk.queueBindSparse(submissionIter->queue->queueHandle, 0u, DE_NULL, fence));
					else
						VK_CHECK(vk.queueBindSparse(submissionIter->queue->queueHandle, 1u, &submissionIter->info.sparse, fence));
				}
				else
				{
					regularFences.push_back(makeVkSharedPtr(createFence(vk, getDevice())));
					VK_CHECK(vk.queueSubmit(submissionIter->queue->queueHandle, 1u, &submissionIter->info.regular, **regularFences.back()));
				}
			}

			if (!waitForFences(vk, getDevice(), bindSparseFences))
				return tcu::TestStatus::fail("vkQueueBindSparse didn't signal the fence");

			if (!waitForFences(vk, getDevice(), regularFences))
				return tcu::TestStatus::fail("Some fences weren't signaled (vkQueueBindSparse didn't signal semaphores?)");
		}

		// May return an error if some waitSemaphores didn't get signaled
		VK_CHECK(vk.deviceWaitIdle(getDevice()));

		return tcu::TestStatus::pass("Pass");
	}